

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_GunFlash(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *player;
  bool bVar2;
  bool bVar3;
  FState *state;
  DObject *this_00;
  char *__assertion;
  AWeapon *this_01;
  FName local_30;
  FName local_2c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c83d8;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_004c83c8;
  this_00 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (DObject *)0x0) goto LAB_004c8242;
    bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004c83d8;
    }
  }
  else {
    if (this_00 != (DObject *)0x0) goto LAB_004c83c8;
LAB_004c8242:
    this_00 = (DObject *)0x0;
  }
  bVar2 = true;
  if (numparam == 1) {
LAB_004c82d2:
    state = (FState *)0x0;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_004c83c8:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_004c83d8;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c83d8;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_004c83c8;
    }
    if ((uint)numparam < 3) goto LAB_004c82d2;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_004c83d8:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4c2,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (numparam == 3) goto LAB_004c82d2;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == 0xff) {
LAB_004c837b:
      state = (FState *)0x0;
    }
    else {
      if (VVar1 != '\x03') {
LAB_004c83f9:
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x4c3,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      state = (FState *)param[3].field_0.field_1.a;
      if (param[3].field_0.field_1.atag != 7) {
        if (state != (FState *)0x0) goto LAB_004c83f9;
        goto LAB_004c837b;
      }
    }
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\0') {
        bVar2 = (undefined1  [16])((undefined1  [16])param[4].field_0 & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0;
      }
      else if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x4c4,"int AF_A_GunFlash(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  player = *(player_t **)&this_00[0xc].ObjectFlags;
  if (player == (player_t *)0x0) {
    return 0;
  }
  if (bVar2) {
    APlayerPawn::PlayAttacking2(player->mo);
  }
  if (state == (FState *)0x0) {
    this_01 = player->ReadyWeapon;
    if (this_01->bAltFire == true) {
      local_2c.Index = 0xa4;
      state = AActor::FindState((AActor *)this_01,&local_2c);
      if (state != (FState *)0x0) goto LAB_004c8335;
      this_01 = player->ReadyWeapon;
    }
    local_30.Index = 0xa3;
    state = AActor::FindState((AActor *)this_01,&local_30);
  }
LAB_004c8335:
  P_SetPsprite(player,PSP_FLASH,state,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_STATE_OPT(flash)	{ flash = nullptr; }
	PARAM_INT_OPT  (flags)	{ flags = 0; }

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}